

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|=(CharClass<char> *this,CharClass<char> *cc)

{
  CharClass<char> local_48;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> local_28;
  
  operator|(&local_48,this,cc);
  local_28.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.m_ranges.
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.m_ranges.
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.m_ranges.
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector(&local_28);
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_001c89b8;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_48.m_ranges);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }